

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * unexpectedZlibError(ZLibOp op,int err,char *msg)

{
  char *pcVar1;
  char *in_RCX;
  uint in_EDX;
  ZLibOp in_SIL;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QMessageLogger::QMessageLogger
            (in_RDI,(char *)in_RDI,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
             in_stack_ffffffffffffff98);
  pcVar1 = zlibOpAsString(in_SIL & Decompression);
  if (in_RCX == (char *)0x0) {
    in_RCX = "";
  }
  QMessageLogger::warning(&local_28,"%s unexpected zlib error: %s (%d)",pcVar1,in_RCX,(ulong)in_EDX)
  ;
  QByteArray::QByteArray((QByteArray *)0x4bb04a);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QByteArray *)in_RDI;
}

Assistant:

Q_DECL_COLD_FUNCTION
static QByteArray unexpectedZlibError(ZLibOp op, int err, const char *msg)
{
    qWarning("%s unexpected zlib error: %s (%d)",
             zlibOpAsString(op),
             msg ? msg : "",
             err);
    return QByteArray();
}